

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_disconnect(connectdata *conn,_Bool dead_connection)

{
  size_t sVar1;
  CURLcode CVar2;
  undefined7 in_register_00000031;
  smtp_conn *smtpc;
  
  if ((((int)CONCAT71(in_register_00000031,dead_connection) == 0) &&
      (sVar1 = (conn->proto).sshc.readdir_len, sVar1 != 0)) && (*(char *)(sVar1 + 0x3a7) == '\x01'))
  {
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
    if (CVar2 == CURLE_OK) {
      (conn->proto).imapc.state = IMAP_APPEND_FINAL;
      do {
        CVar2 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true,true);
        if ((conn->proto).imapc.state == IMAP_STOP) break;
      } while (CVar2 == CURLE_OK);
    }
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,(conn->proto).ftpc.cwdcount);
  (*Curl_cfree)((conn->proto).ftpc.dirs);
  (conn->proto).ftpc.dirs = (char **)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The SMTP session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && smtpc->pp.conn && smtpc->pp.conn->bits.protoconnstart)
    if(!smtp_perform_quit(conn))
      (void)smtp_block_statemach(conn, TRUE); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&smtpc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, smtpc->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(smtpc->domain);

  return CURLE_OK;
}